

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hamt_map.hpp
# Opt level: O0

pair<pstore::index::details::index_pointer,_bool> __thiscall
pstore::index::
hamt_map<pstore::indirect_string,pstore::index::details::empty_class,pstore::index::fnv_64a_hash_indirect_string,std::equal_to<pstore::indirect_string>>
::insert_into_internal<std::pair<pstore::indirect_string,pstore::index::details::empty_class>>
          (hamt_map<pstore::indirect_string,pstore::index::details::empty_class,pstore::index::fnv_64a_hash_indirect_string,std::equal_to<pstore::indirect_string>>
           *this,transaction_base *transaction,index_pointer node,
          pair<pstore::indirect_string,_pstore::index::details::empty_class> *value,hash_type hash,
          uint shifts,
          not_null<pstore::array_stack<pstore::index::details::parent_type,_13UL>_*> parents,
          bool is_upsert)

{
  bool bVar1;
  database *db;
  pointer pcVar2;
  internal_node *this_00;
  array_stack<pstore::index::details::parent_type,_13UL> *this_01;
  undefined8 extraout_RDX;
  pair<pstore::index::details::index_pointer,_bool> pVar3;
  parent_type local_198;
  index_pointer local_188;
  index_pointer *local_180;
  index_pointer *child;
  internal_node *local_170;
  internal_node *inode_1;
  index_pointer local_158;
  undefined1 local_150;
  hamt_map<pstore::indirect_string,_pstore::index::details::empty_class,_pstore::index::fnv_64a_hash_indirect_string,_std::equal_to<pstore::indirect_string>_>
  *local_148;
  size_t local_140;
  index_pointer local_138;
  undefined1 local_130;
  index_pointer local_128;
  index_pointer new_child;
  undefined4 local_118;
  bool key_exists;
  index_pointer local_110;
  hamt_map<pstore::indirect_string,_pstore::index::details::empty_class,_pstore::index::fnv_64a_hash_indirect_string,_std::equal_to<pstore::indirect_string>_>
  *local_108;
  hamt_map<pstore::indirect_string,_pstore::index::details::empty_class,_pstore::index::fnv_64a_hash_indirect_string,_std::equal_to<pstore::indirect_string>_>
  *local_100;
  value_type local_f8;
  index_pointer local_f0;
  array_stack<pstore::index::details::parent_type,_13UL> *local_e8;
  internal_node *local_e0;
  internal_node *inode;
  pair<pstore::index::details::index_pointer,_unsigned_long> local_c8;
  size_t local_b8;
  size_t index;
  index_pointer child_slot;
  array_stack<pstore::index::details::parent_type,_13UL> *local_88;
  pair<std::shared_ptr<const_pstore::index::details::internal_node>,_const_pstore::index::details::internal_node_*>
  local_80;
  internal_node *local_68;
  internal_node *internal;
  shared_ptr<const_pstore::index::details::internal_node> iptr;
  bool is_upsert_local;
  uint shifts_local;
  hash_type hash_local;
  pair<pstore::indirect_string,_pstore::index::details::empty_class> *value_local;
  transaction_base *transaction_local;
  hamt_map<pstore::indirect_string,_pstore::index::details::empty_class,_pstore::index::fnv_64a_hash_indirect_string,_std::equal_to<pstore::indirect_string>_>
  *this_local;
  not_null<pstore::array_stack<pstore::index::details::parent_type,_13UL>_*> parents_local;
  index_pointer node_local;
  undefined1 local_10;
  
  this_local = (hamt_map<pstore::indirect_string,_pstore::index::details::empty_class,_pstore::index::fnv_64a_hash_indirect_string,_std::equal_to<pstore::indirect_string>_>
                *)parents.ptr_;
  iptr.super___shared_ptr<const_pstore::index::details::internal_node,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi._3_1_ = is_upsert;
  iptr.super___shared_ptr<const_pstore::index::details::internal_node,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi._4_4_ = shifts;
  parents_local.ptr_ = (array_stack<pstore::index::details::parent_type,_13UL> *)node;
  std::shared_ptr<const_pstore::index::details::internal_node>::shared_ptr
            ((shared_ptr<const_pstore::index::details::internal_node> *)&internal);
  local_68 = (internal_node *)0x0;
  db = transaction_base::db(transaction);
  local_88 = parents_local.ptr_;
  details::internal_node::get_node(&local_80,db,(index_pointer)parents_local.ptr_);
  std::
  tie<std::shared_ptr<pstore::index::details::internal_node_const>,pstore::index::details::internal_node_const*>
            ((shared_ptr<const_pstore::index::details::internal_node> *)&child_slot.addr_,&internal)
  ;
  std::
  tuple<std::shared_ptr<pstore::index::details::internal_node_const>&,pstore::index::details::internal_node_const*&>
  ::operator=((tuple<std::shared_ptr<pstore::index::details::internal_node_const>&,pstore::index::details::internal_node_const*&>
               *)&child_slot.addr_,&local_80);
  std::
  pair<std::shared_ptr<const_pstore::index::details::internal_node>,_const_pstore::index::details::internal_node_*>
  ::~pair(&local_80);
  if (local_68 == (internal_node *)0x0) {
    assert_failed("internal != nullptr",
                  "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/core/hamt_map.hpp"
                  ,0x32c);
  }
  details::index_pointer::index_pointer((index_pointer *)&index);
  local_b8 = 0;
  local_c8 = details::internal_node::lookup(local_68,(ulong)((uint)hash & 0x3f));
  std::tie<pstore::index::details::index_pointer,unsigned_long>((index_pointer *)&inode,&index);
  std::tuple<pstore::index::details::index_pointer&,unsigned_long&>::operator=
            ((tuple<pstore::index::details::index_pointer&,unsigned_long&> *)&inode,&local_c8);
  if (local_b8 == 0xffffffffffffffff) {
    pcVar2 = std::
             unique_ptr<pstore::chunked_sequence<pstore::index::details::internal_node,_10922UL,_528UL,_8UL>,_std::default_delete<pstore::chunked_sequence<pstore::index::details::internal_node,_10922UL,_528UL,_8UL>_>_>
             ::get((unique_ptr<pstore::chunked_sequence<pstore::index::details::internal_node,_10922UL,_528UL,_8UL>,_std::default_delete<pstore::chunked_sequence<pstore::index::details::internal_node,_10922UL,_528UL,_8UL>_>_>
                    *)(this + 8));
    local_e8 = parents_local.ptr_;
    this_00 = details::internal_node::
              make_writable<pstore::chunked_sequence<pstore::index::details::internal_node,10922ul,528ul,8ul>,void>
                        (pcVar2,(index_pointer)parents_local.ptr_,local_68);
    local_100 = this_local;
    local_e0 = this_00;
    local_f8 = (value_type)
               store_leaf_node<std::pair<pstore::indirect_string,pstore::index::details::empty_class>>
                         (this,transaction,value,
                          (not_null<pstore::array_stack<pstore::index::details::parent_type,_13UL>_*>
                           )this_local);
    details::index_pointer::index_pointer((index_pointer *)&local_f0.addr_,(address)local_f8);
    local_108 = this_local;
    details::internal_node::insert_child
              (this_00,hash,local_f0,
               (not_null<pstore::array_stack<pstore::index::details::parent_type,_13UL>_*>)
               this_local);
    details::index_pointer::index_pointer((index_pointer *)&local_110.addr_,local_e0);
    key_exists = false;
    std::pair<pstore::index::details::index_pointer,_bool>::
    pair<pstore::index::details::index_pointer,_bool,_true>
              ((pair<pstore::index::details::index_pointer,_bool> *)&node_local.addr_,&local_110,
               &key_exists);
  }
  else {
    iptr.super___shared_ptr<const_pstore::index::details::internal_node,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi._4_4_ =
         iptr.
         super___shared_ptr<const_pstore::index::details::internal_node,_(__gnu_cxx::_Lock_policy)2>
         ._M_refcount._M_pi._4_4_ + 6;
    details::index_pointer::index_pointer((index_pointer *)&local_128.addr_);
    local_140 = index;
    local_148 = this_local;
    pVar3 = insert_node<std::pair<pstore::indirect_string,pstore::index::details::empty_class>>
                      (this,transaction,(index_pointer)index,value,hash >> 6,
                       iptr.
                       super___shared_ptr<const_pstore::index::details::internal_node,_(__gnu_cxx::_Lock_policy)2>
                       ._M_refcount._M_pi._4_4_,
                       (not_null<pstore::array_stack<pstore::index::details::parent_type,_13UL>_*>)
                       this_local,
                       (bool)(iptr.
                              super___shared_ptr<const_pstore::index::details::internal_node,_(__gnu_cxx::_Lock_policy)2>
                              ._M_refcount._M_pi._3_1_ & 1));
    local_158 = pVar3.first;
    local_150 = pVar3.second;
    local_138 = local_158;
    local_130 = local_150;
    std::tie<pstore::index::details::index_pointer,bool>
              ((index_pointer *)&inode_1,(bool *)&local_128);
    std::tuple<pstore::index::details::index_pointer&,bool&>::operator=
              ((tuple<pstore::index::details::index_pointer&,bool&> *)&inode_1,
               (pair<pstore::index::details::index_pointer,_bool> *)&local_138.addr_);
    bVar1 = details::index_pointer::operator!=
                      ((index_pointer *)&local_128.addr_,(index_pointer *)&index);
    if (bVar1) {
      pcVar2 = std::
               unique_ptr<pstore::chunked_sequence<pstore::index::details::internal_node,_10922UL,_528UL,_8UL>,_std::default_delete<pstore::chunked_sequence<pstore::index::details::internal_node,_10922UL,_528UL,_8UL>_>_>
               ::get((unique_ptr<pstore::chunked_sequence<pstore::index::details::internal_node,_10922UL,_528UL,_8UL>,_std::default_delete<pstore::chunked_sequence<pstore::index::details::internal_node,_10922UL,_528UL,_8UL>_>_>
                      *)(this + 8));
      child = (index_pointer *)parents_local.ptr_;
      local_170 = details::internal_node::
                  make_writable<pstore::chunked_sequence<pstore::index::details::internal_node,10922ul,528ul,8ul>,void>
                            (pcVar2,(index_pointer)parents_local.ptr_,local_68);
      local_180 = details::internal_node::operator[](local_170,local_b8);
      local_188 = *local_180;
      hamt_map<pstore::indirect_string,_pstore::index::details::empty_class,_pstore::index::fnv_64a_hash_indirect_string,_std::equal_to<pstore::indirect_string>_>
      ::delete_node((hamt_map<pstore::indirect_string,_pstore::index::details::empty_class,_pstore::index::fnv_64a_hash_indirect_string,_std::equal_to<pstore::indirect_string>_>
                     *)this,local_188,
                    iptr.
                    super___shared_ptr<const_pstore::index::details::internal_node,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount._M_pi._4_4_);
      *local_180 = local_128;
      details::index_pointer::operator=((index_pointer *)&parents_local,local_170);
    }
    this_01 = gsl::not_null<pstore::array_stack<pstore::index::details::parent_type,_13UL>_*>::
              operator->((not_null<pstore::array_stack<pstore::index::details::parent_type,_13UL>_*>
                          *)&this_local);
    details::parent_type::parent_type(&local_198,(index_pointer)parents_local.ptr_,local_b8);
    array_stack<pstore::index::details::parent_type,_13UL>::push(this_01,&local_198);
    std::pair<pstore::index::details::index_pointer,_bool>::
    pair<pstore::index::details::index_pointer_&,_bool_&,_true>
              ((pair<pstore::index::details::index_pointer,_bool> *)&node_local.addr_,
               (index_pointer *)&parents_local,(bool *)((long)&new_child.addr_.a_ + 7));
  }
  local_118 = 1;
  std::shared_ptr<const_pstore::index::details::internal_node>::~shared_ptr
            ((shared_ptr<const_pstore::index::details::internal_node> *)&internal);
  pVar3._9_7_ = (undefined7)((ulong)extraout_RDX >> 8);
  pVar3.second = (bool)local_10;
  pVar3.first.internal_ = node_local.internal_;
  return pVar3;
}

Assistant:

auto hamt_map<KeyType, ValueType, Hash, KeyEqual>::insert_into_internal (
            transaction_base & transaction, index_pointer node, OtherValueType const & value,
            hash_type hash, unsigned shifts, gsl::not_null<parent_stack *> parents, bool is_upsert)
            -> std::pair<index_pointer, bool> {

            std::shared_ptr<internal_node const> iptr;
            internal_node const * internal = nullptr;
            std::tie (iptr, internal) = internal_node::get_node (transaction.db (), node);
            PSTORE_ASSERT (internal != nullptr);

            // Now work out which of the children we're going to be visiting next.
            index_pointer child_slot;
            auto index = std::size_t{0};
            std::tie (child_slot, index) = internal->lookup (hash & details::hash_index_mask);

            // If this slot isn't used, then ensure the node is on the heap, write the new leaf node
            // and point to it.
            if (index == details::not_found) {
                internal_node * const inode =
                    internal_node::make_writable (internals_container_.get (), node, *internal);
                inode->insert_child (
                    hash, index_pointer{this->store_leaf_node (transaction, value, parents)},
                    parents);
                return {index_pointer{inode}, false};
            }

            shifts += details::hash_index_bits;
            hash >>= details::hash_index_bits;

            // update child_slot
            bool key_exists;
            index_pointer new_child;
            std::tie (new_child, key_exists) = this->insert_node (transaction, child_slot, value,
                                                                  hash, shifts, parents, is_upsert);

            // If the insertion resulted in our child node being reallocated, then this node needs
            // to be heap-allocated and the child reference updated. The original child pointer may
            // also need to be freed.
            if (new_child != child_slot) {
                internal_node * const inode =
                    internal_node::make_writable (internals_container_.get (), node, *internal);

                // Release a previous heap-allocated instance.
                index_pointer & child = (*inode)[index];
                this->delete_node (child, shifts);
                child = new_child;
                node = inode;
            }

            parents->push (details::parent_type{node, index});
            return {node, key_exists};
        }